

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# singleline.h
# Opt level: O3

void __thiscall bandit::reporter::singleline::test_run_complete(singleline *this)

{
  ostream *poVar1;
  char cVar2;
  
  poVar1 = (this->super_colored_base).stm_;
  cVar2 = (char)poVar1;
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + cVar2);
  std::ostream::put(cVar2);
  std::ostream::flush();
  summary::write((int)(this->super_colored_base).stm_,
                 (void *)(ulong)(uint)(this->super_colored_base).super_progress_base.specs_run_,
                 (ulong)(uint)(this->super_colored_base).super_progress_base.specs_failed_);
  return;
}

Assistant:

void test_run_complete() override {
        progress_base::test_run_complete();

        stm_ << std::endl;

        summary::write(stm_, specs_run_, specs_failed_, specs_succeeded_, specs_skipped_, failures_,
            test_run_errors_, colorizer_);
      }